

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,unsigned_long_long s)

{
  bool bVar1;
  reference pvVar2;
  MessageBuilder<1024UL> *this_00;
  ulong in_RSI;
  array<char,_16UL> *in_RDI;
  value_type_conflict c;
  iterator __end2;
  iterator __begin2;
  Array<char,_16> *__range2;
  bool skipZero;
  long i;
  char hexdigits [17];
  Array<char,_16> buf;
  undefined7 in_stack_ffffffffffffff88;
  value_type_conflict vVar3;
  char in_stack_ffffffffffffff9f;
  MessageBuilder<1024UL> *in_stack_ffffffffffffffa0;
  MessageBuilder<1024UL> *local_58;
  size_type local_40;
  char local_38 [24];
  array<char,_16UL> local_20;
  ulong local_10;
  
  local_10 = in_RSI;
  append_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  append_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  memset(&local_20,0,0x10);
  builtin_strncpy(local_38,"0123456789abcdef",0x11);
  local_40 = std::array<char,_16UL>::size(&local_20);
  while (local_40 = local_40 - 1, -1 < (long)local_40) {
    vVar3 = local_38[local_10 & 0xf];
    pvVar2 = std::array<char,_16UL>::operator[](in_RDI,CONCAT17(vVar3,in_stack_ffffffffffffff88));
    *pvVar2 = vVar3;
    local_10 = local_10 >> 4;
  }
  bVar1 = true;
  local_58 = (MessageBuilder<1024UL> *)std::array<char,_16UL>::begin((array<char,_16UL> *)0x14c1fc);
  this_00 = (MessageBuilder<1024UL> *)std::array<char,_16UL>::end((array<char,_16UL> *)0x14c20b);
  for (; local_58 != this_00; local_58 = (MessageBuilder<1024UL> *)((local_58->buffer)._M_elems + 1)
      ) {
    in_stack_ffffffffffffff9f = (local_58->buffer)._M_elems[0];
    if ((!bVar1) || (in_stack_ffffffffffffff9f != '0')) {
      bVar1 = false;
      append_char(this_00,in_stack_ffffffffffffff9f);
    }
  }
  if (bVar1) {
    append_char(this_00,in_stack_ffffffffffffff9f);
  }
  return;
}

Assistant:

void append(unsigned long long s)
    {
      append_char('0');
      append_char('x');
      stl::Array<char, 16> buf{{0}};
      const char hexdigits[] = "0123456789abcdef";
      // Length of string including null terminator
      static_assert(sizeof(hexdigits) == 0x11);
      for (long i = static_cast<long>(buf.size() - 1); i >= 0; i--)
      {
        buf[static_cast<size_t>(i)] = hexdigits[s & 0xf];
        s >>= 4;
      }
      bool skipZero = true;
      for (auto c : buf)
      {
        if (skipZero && (c == '0'))
        {
          continue;
        }
        skipZero = false;
        append_char(c);
      }
      if (skipZero)
      {
        append_char('0');
      }
    }